

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_averages_and_directions.cpp
# Opt level: O2

void compute_avgs_and_dirs_3_comp_rgb(partition_info *pi,image_block *blk,partition_metrics *pm)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  float fVar4;
  float fVar5;
  float fVar7;
  __m128 afVar9;
  undefined1 auVar10 [32];
  ulong uVar11;
  uint uVar12;
  uint8_t (*pauVar13) [216];
  uint i;
  ulong uVar14;
  ulong uVar15;
  uint i_3;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  float fVar22;
  undefined1 auVar21 [64];
  float fVar39;
  float fVar40;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar51;
  float fVar52;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar53;
  undefined1 auVar50 [32];
  float fVar54;
  float fVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  float fVar79;
  float fVar80;
  undefined4 uVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  float fVar92;
  float fVar93;
  undefined1 auVar91 [16];
  float fVar94;
  undefined1 auVar95 [16];
  undefined1 auVar96 [32];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  float fVar102;
  float fVar103;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar104;
  undefined1 auVar105 [16];
  float fVar107;
  float fVar108;
  undefined1 auVar106 [16];
  float fVar109;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  vfloat4 partition_averages [4];
  float fVar6;
  float fVar8;
  
  uVar3 = pi->partition_count;
  uVar11 = (ulong)uVar3;
  if (uVar11 == 0) {
    __assert_fail("partition_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_averages_and_directions.cpp"
                  ,0x23e,
                  "void compute_avgs_and_dirs_3_comp_rgb(const partition_info &, const image_block &, partition_metrics *)"
                 );
  }
  bVar1 = blk->texel_count;
  uVar15 = (ulong)bVar1;
  if (bVar1 == 0) {
    __assert_fail("texel_count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_averages_and_directions.cpp"
                  ,0x36,
                  "void compute_partition_averages_rgb(const partition_info &, const image_block &, vfloat4 *)"
                 );
  }
  if (uVar11 == 1) {
    afVar9 = (__m128)vblendps_avx(ZEXT816(0) << 0x40,*(undefined1 (*) [16])(blk->data_mean).m,7);
    partition_averages[0].m[0] = afVar9[0];
    partition_averages[0].m[1] = afVar9[1];
    partition_averages[0].m[2] = afVar9[2];
    partition_averages[0].m[3] = afVar9[3];
  }
  else {
    uVar12 = CONCAT31(0,bVar1);
    if (uVar3 == 2) {
      auVar50[4] = bVar1;
      auVar50._0_4_ = uVar12;
      auVar50._5_3_ = 0;
      auVar50[8] = bVar1;
      auVar50._9_3_ = 0;
      auVar50[0xc] = bVar1;
      auVar50._13_3_ = 0;
      auVar50[0x10] = bVar1;
      auVar50._17_3_ = 0;
      auVar50[0x14] = bVar1;
      auVar50._21_3_ = 0;
      auVar50[0x18] = bVar1;
      auVar50._25_3_ = 0;
      auVar50[0x1c] = bVar1;
      auVar50._29_3_ = 0;
      auVar20 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      auVar85._8_4_ = 8;
      auVar85._0_8_ = 0x800000008;
      auVar85._12_4_ = 8;
      auVar85._16_4_ = 8;
      auVar85._20_4_ = 8;
      auVar85._24_4_ = 8;
      auVar85._28_4_ = 8;
      uVar14 = 0;
      auVar63 = ZEXT816(0);
      auVar24 = ZEXT816(0);
      auVar21 = ZEXT1664((undefined1  [16])0x0);
      while( true ) {
        fVar42 = auVar63._4_4_;
        fVar5 = auVar63._8_4_;
        fVar4 = auVar24._4_4_;
        fVar6 = auVar24._8_4_;
        fVar7 = auVar63._12_4_;
        fVar8 = auVar24._12_4_;
        if (uVar15 <= uVar14) break;
        auVar10 = vpcmpgtd_avx2(auVar50,auVar20);
        auVar20 = vpaddd_avx2(auVar20,auVar85);
        auVar86._8_8_ = 0;
        auVar86._0_8_ = *(ulong *)(pi->partition_of_texel + uVar14);
        auVar16 = vpcmpeqb_avx(auVar86,(undefined1  [16])0x0);
        auVar78 = vpmovsxbd_avx2(auVar16);
        auVar10 = vpand_avx2(auVar10,auVar78);
        auVar78 = vpand_avx2(auVar10,*(undefined1 (*) [32])(blk->data_r + uVar14));
        auVar63._0_4_ = auVar78._16_4_ + auVar78._0_4_ + auVar63._0_4_;
        auVar63._4_4_ = auVar78._20_4_ + auVar78._4_4_ + fVar42;
        auVar63._8_4_ = auVar78._24_4_ + auVar78._8_4_ + fVar5;
        auVar63._12_4_ = auVar78._28_4_ + auVar78._12_4_ + fVar7;
        auVar78 = vpand_avx2(auVar10,*(undefined1 (*) [32])(blk->data_g + uVar14));
        auVar24._0_4_ = auVar78._16_4_ + auVar78._0_4_ + auVar24._0_4_;
        auVar24._4_4_ = auVar78._20_4_ + auVar78._4_4_ + fVar4;
        auVar24._8_4_ = auVar78._24_4_ + auVar78._8_4_ + fVar6;
        auVar24._12_4_ = auVar78._28_4_ + auVar78._12_4_ + fVar8;
        auVar10 = vpand_avx2(auVar10,*(undefined1 (*) [32])(blk->data_b + uVar14));
        auVar21 = ZEXT1664(CONCAT412(auVar10._28_4_ + auVar21._12_4_ + auVar10._12_4_,
                                     CONCAT48(auVar10._24_4_ + auVar21._8_4_ + auVar10._8_4_,
                                              CONCAT44(auVar10._20_4_ +
                                                       auVar21._4_4_ + auVar10._4_4_,
                                                       auVar10._16_4_ +
                                                       auVar21._0_4_ + auVar10._0_4_))));
        uVar14 = uVar14 + 8;
      }
      fVar54 = (float)uVar12;
      auVar26 = vpblendd_avx2((undefined1  [16])0x0,*(undefined1 (*) [16])(blk->data_mean).m,7);
      auVar16 = vshufpd_avx(auVar63,auVar63,1);
      auVar64._0_4_ = auVar63._0_4_ + auVar16._0_4_;
      auVar64._4_4_ = fVar42 + auVar16._4_4_;
      auVar64._8_4_ = fVar5 + auVar16._8_4_;
      auVar64._12_4_ = fVar7 + auVar16._12_4_;
      auVar63 = vhaddps_avx(auVar64,auVar64);
      auVar16 = vshufpd_avx(auVar24,auVar24,1);
      auVar25._0_4_ = auVar24._0_4_ + auVar16._0_4_;
      auVar25._4_4_ = fVar4 + auVar16._4_4_;
      auVar25._8_4_ = fVar6 + auVar16._8_4_;
      auVar25._12_4_ = fVar8 + auVar16._12_4_;
      auVar24 = vhaddps_avx(auVar25,auVar25);
      auVar45._0_4_ = fVar54 * auVar26._0_4_;
      auVar45._4_4_ = fVar54 * auVar26._4_4_;
      auVar45._8_4_ = fVar54 * auVar26._8_4_;
      auVar45._12_4_ = fVar54 * auVar26._12_4_;
      auVar63 = vinsertps_avx(auVar63,auVar24,0x1c);
      auVar24 = vshufpd_avx(auVar21._0_16_,auVar21._0_16_,1);
      auVar16._0_4_ = auVar21._0_4_ + auVar24._0_4_;
      auVar16._4_4_ = auVar21._4_4_ + auVar24._4_4_;
      auVar16._8_4_ = auVar21._8_4_ + auVar24._8_4_;
      auVar16._12_4_ = auVar21._12_4_ + auVar24._12_4_;
      auVar24 = vhaddps_avx(auVar16,auVar16);
      fVar42 = (float)pi->partition_texel_count[0];
      auVar24 = vblendps_avx(auVar63,auVar24,4);
      auVar26._4_4_ = fVar42;
      auVar26._0_4_ = fVar42;
      auVar26._8_4_ = fVar42;
      auVar26._12_4_ = fVar42;
      afVar9 = (__m128)vdivps_avx(auVar24,auVar26);
      partition_averages[0].m[0] = afVar9[0];
      partition_averages[0].m[1] = afVar9[1];
      partition_averages[0].m[2] = afVar9[2];
      partition_averages[0].m[3] = afVar9[3];
      auVar27._0_4_ = (float)pi->partition_texel_count[1];
      auVar24 = vsubps_avx(auVar45,auVar24);
      auVar27._4_4_ = auVar27._0_4_;
      auVar27._8_4_ = auVar27._0_4_;
      auVar27._12_4_ = auVar27._0_4_;
      afVar9 = (__m128)vdivps_avx(auVar24,auVar27);
      partition_averages[1].m[0] = afVar9[0];
      partition_averages[1].m[1] = afVar9[1];
      partition_averages[1].m[2] = afVar9[2];
      partition_averages[1].m[3] = afVar9[3];
    }
    else if (uVar3 == 3) {
      auVar78[4] = bVar1;
      auVar78._0_4_ = uVar12;
      auVar78._5_3_ = 0;
      auVar78[8] = bVar1;
      auVar78._9_3_ = 0;
      auVar78[0xc] = bVar1;
      auVar78._13_3_ = 0;
      auVar78[0x10] = bVar1;
      auVar78._17_3_ = 0;
      auVar78[0x14] = bVar1;
      auVar78._21_3_ = 0;
      auVar78[0x18] = bVar1;
      auVar78._25_3_ = 0;
      auVar78[0x1c] = bVar1;
      auVar78._29_3_ = 0;
      auVar20 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
      uVar14 = 0;
      auVar96._8_4_ = 8;
      auVar96._0_8_ = 0x800000008;
      auVar96._12_4_ = 8;
      auVar96._16_4_ = 8;
      auVar96._20_4_ = 8;
      auVar96._24_4_ = 8;
      auVar96._28_4_ = 8;
      auVar97[8] = 1;
      auVar97._0_8_ = 0x101010101010101;
      auVar97[9] = 1;
      auVar97[10] = 1;
      auVar97[0xb] = 1;
      auVar97[0xc] = 1;
      auVar97[0xd] = 1;
      auVar97[0xe] = 1;
      auVar97[0xf] = 1;
      auVar91 = ZEXT816(0) << 0x40;
      auVar62 = ZEXT816(0);
      auVar56 = ZEXT816(0);
      auVar44 = ZEXT816(0);
      auVar23 = ZEXT816(0);
      auVar21 = ZEXT1664((undefined1  [16])0x0);
      while( true ) {
        fVar4 = auVar62._4_4_;
        fVar7 = auVar62._8_4_;
        fVar43 = auVar62._12_4_;
        fVar42 = auVar56._4_4_;
        fVar8 = auVar56._8_4_;
        fVar53 = auVar56._12_4_;
        fVar92 = auVar91._4_4_;
        fVar93 = auVar91._8_4_;
        fVar6 = auVar44._4_4_;
        fVar54 = auVar44._8_4_;
        fVar5 = auVar23._4_4_;
        fVar41 = auVar23._8_4_;
        fVar55 = auVar44._12_4_;
        fVar61 = auVar23._12_4_;
        fVar94 = auVar91._12_4_;
        if (uVar15 <= uVar14) break;
        auVar85 = vpcmpgtd_avx2(auVar78,auVar20);
        auVar20 = vpaddd_avx2(auVar96,auVar20);
        auVar100._8_8_ = 0;
        auVar100._0_8_ = *(ulong *)(pi->partition_of_texel + uVar14);
        auVar24 = vpcmpeqb_avx(auVar100,(undefined1  [16])0x0);
        auVar50 = vpmovsxbd_avx2(auVar24);
        auVar50 = vpand_avx2(auVar50,auVar85);
        auVar24 = vpcmpeqb_avx(auVar100,auVar97);
        auVar10 = vpmovsxbd_avx2(auVar24);
        auVar85 = vpand_avx2(auVar10,auVar85);
        auVar10 = vpand_avx2(auVar50,*(undefined1 (*) [32])(blk->data_r + uVar14));
        auVar91._0_4_ = auVar10._16_4_ + auVar91._0_4_ + auVar10._0_4_;
        auVar91._4_4_ = auVar10._20_4_ + fVar92 + auVar10._4_4_;
        auVar91._8_4_ = auVar10._24_4_ + fVar93 + auVar10._8_4_;
        auVar91._12_4_ = auVar10._28_4_ + fVar94 + auVar10._12_4_;
        auVar10 = vpand_avx2(auVar85,*(undefined1 (*) [32])(blk->data_r + uVar14));
        auVar44._0_4_ = auVar10._16_4_ + auVar10._0_4_ + auVar44._0_4_;
        auVar44._4_4_ = auVar10._20_4_ + auVar10._4_4_ + fVar6;
        auVar44._8_4_ = auVar10._24_4_ + auVar10._8_4_ + fVar54;
        auVar44._12_4_ = auVar10._28_4_ + auVar10._12_4_ + fVar55;
        auVar10 = vpand_avx2(auVar50,*(undefined1 (*) [32])(blk->data_g + uVar14));
        auVar62._0_4_ = auVar10._16_4_ + auVar10._0_4_ + auVar62._0_4_;
        auVar62._4_4_ = auVar10._20_4_ + auVar10._4_4_ + fVar4;
        auVar62._8_4_ = auVar10._24_4_ + auVar10._8_4_ + fVar7;
        auVar62._12_4_ = auVar10._28_4_ + auVar10._12_4_ + fVar43;
        auVar10 = vpand_avx2(auVar85,*(undefined1 (*) [32])(blk->data_g + uVar14));
        auVar23._0_4_ = auVar10._16_4_ + auVar10._0_4_ + auVar23._0_4_;
        auVar23._4_4_ = auVar10._20_4_ + auVar10._4_4_ + fVar5;
        auVar23._8_4_ = auVar10._24_4_ + auVar10._8_4_ + fVar41;
        auVar23._12_4_ = auVar10._28_4_ + auVar10._12_4_ + fVar61;
        auVar50 = vpand_avx2(auVar50,*(undefined1 (*) [32])(blk->data_b + uVar14));
        auVar56._0_4_ = auVar50._16_4_ + auVar50._0_4_ + auVar56._0_4_;
        auVar56._4_4_ = auVar50._20_4_ + auVar50._4_4_ + fVar42;
        auVar56._8_4_ = auVar50._24_4_ + auVar50._8_4_ + fVar8;
        auVar56._12_4_ = auVar50._28_4_ + auVar50._12_4_ + fVar53;
        auVar50 = vpand_avx2(auVar85,*(undefined1 (*) [32])(blk->data_b + uVar14));
        auVar21 = ZEXT1664(CONCAT412(auVar50._28_4_ + auVar50._12_4_ + auVar21._12_4_,
                                     CONCAT48(auVar50._24_4_ + auVar50._8_4_ + auVar21._8_4_,
                                              CONCAT44(auVar50._20_4_ +
                                                       auVar50._4_4_ + auVar21._4_4_,
                                                       auVar50._16_4_ +
                                                       auVar50._0_4_ + auVar21._0_4_))));
        uVar14 = uVar14 + 8;
      }
      fVar79 = (float)uVar12;
      auVar24 = vshufpd_avx(auVar91,auVar91,1);
      auVar88._0_4_ = auVar91._0_4_ + auVar24._0_4_;
      auVar88._4_4_ = fVar92 + auVar24._4_4_;
      auVar88._8_4_ = fVar93 + auVar24._8_4_;
      auVar88._12_4_ = fVar94 + auVar24._12_4_;
      auVar24 = vhaddps_avx(auVar88,auVar88);
      auVar26 = vpblendd_avx2((undefined1  [16])0x0,*(undefined1 (*) [16])(blk->data_mean).m,7);
      auVar63 = vshufpd_avx(auVar62,auVar62,1);
      auVar66._0_4_ = auVar63._0_4_ + auVar62._0_4_;
      auVar66._4_4_ = auVar63._4_4_ + fVar4;
      auVar66._8_4_ = auVar63._8_4_ + fVar7;
      auVar66._12_4_ = auVar63._12_4_ + fVar43;
      auVar63 = vhaddps_avx(auVar66,auVar66);
      auVar16 = vshufpd_avx(auVar56,auVar56,1);
      auVar58._0_4_ = auVar16._0_4_ + auVar56._0_4_;
      auVar58._4_4_ = auVar16._4_4_ + fVar42;
      auVar58._8_4_ = auVar16._8_4_ + fVar8;
      auVar58._12_4_ = auVar16._12_4_ + fVar53;
      auVar16 = vhaddps_avx(auVar58,auVar58);
      auVar72._0_4_ = fVar79 * auVar26._0_4_;
      auVar72._4_4_ = fVar79 * auVar26._4_4_;
      auVar72._8_4_ = fVar79 * auVar26._8_4_;
      auVar72._12_4_ = fVar79 * auVar26._12_4_;
      auVar26 = vshufpd_avx(auVar44,auVar44,1);
      auVar47._0_4_ = auVar44._0_4_ + auVar26._0_4_;
      auVar47._4_4_ = fVar6 + auVar26._4_4_;
      auVar47._8_4_ = fVar54 + auVar26._8_4_;
      auVar47._12_4_ = fVar55 + auVar26._12_4_;
      auVar26 = vhaddps_avx(auVar47,auVar47);
      auVar25 = vshufpd_avx(auVar23,auVar23,1);
      auVar29._0_4_ = auVar23._0_4_ + auVar25._0_4_;
      auVar29._4_4_ = fVar5 + auVar25._4_4_;
      auVar29._8_4_ = fVar41 + auVar25._8_4_;
      auVar29._12_4_ = fVar61 + auVar25._12_4_;
      auVar25 = vhaddps_avx(auVar29,auVar29);
      auVar24 = vinsertps_avx(auVar24,auVar63,0x1c);
      auVar24 = vblendps_avx(auVar24,auVar16,4);
      auVar16 = vinsertps_avx(auVar26,auVar25,0x1c);
      auVar63 = vshufpd_avx(auVar21._0_16_,auVar21._0_16_,1);
      auVar18._0_4_ = auVar21._0_4_ + auVar63._0_4_;
      auVar18._4_4_ = auVar21._4_4_ + auVar63._4_4_;
      auVar18._8_4_ = auVar21._8_4_ + auVar63._8_4_;
      auVar18._12_4_ = auVar21._12_4_ + auVar63._12_4_;
      auVar63 = vhaddps_avx(auVar18,auVar18);
      fVar42 = (float)pi->partition_texel_count[0];
      auVar63 = vblendps_avx(auVar16,auVar63,4);
      auVar30._4_4_ = fVar42;
      auVar30._0_4_ = fVar42;
      auVar30._8_4_ = fVar42;
      auVar30._12_4_ = fVar42;
      afVar9 = (__m128)vdivps_avx(auVar24,auVar30);
      partition_averages[0].m[0] = afVar9[0];
      partition_averages[0].m[1] = afVar9[1];
      partition_averages[0].m[2] = afVar9[2];
      partition_averages[0].m[3] = afVar9[3];
      auVar31._0_4_ = (float)pi->partition_texel_count[1];
      auVar24 = vsubps_avx(auVar72,auVar24);
      auVar31._4_4_ = auVar31._0_4_;
      auVar31._8_4_ = auVar31._0_4_;
      auVar31._12_4_ = auVar31._0_4_;
      afVar9 = (__m128)vdivps_avx(auVar63,auVar31);
      partition_averages[1].m[0] = afVar9[0];
      partition_averages[1].m[1] = afVar9[1];
      partition_averages[1].m[2] = afVar9[2];
      partition_averages[1].m[3] = afVar9[3];
      auVar32._0_4_ = (float)pi->partition_texel_count[2];
      auVar24 = vsubps_avx(auVar24,auVar63);
      auVar32._4_4_ = auVar32._0_4_;
      auVar32._8_4_ = auVar32._0_4_;
      auVar32._12_4_ = auVar32._0_4_;
      afVar9 = (__m128)vdivps_avx(auVar24,auVar32);
      partition_averages[2].m[0] = afVar9[0];
      partition_averages[2].m[1] = afVar9[1];
      partition_averages[2].m[2] = afVar9[2];
      partition_averages[2].m[3] = afVar9[3];
    }
    else {
      auVar20[4] = bVar1;
      auVar20._0_4_ = uVar12;
      auVar20._5_3_ = 0;
      auVar20[8] = bVar1;
      auVar20._9_3_ = 0;
      auVar20[0xc] = bVar1;
      auVar20._13_3_ = 0;
      auVar20[0x10] = bVar1;
      auVar20._17_3_ = 0;
      auVar20[0x14] = bVar1;
      auVar20._21_3_ = 0;
      auVar20[0x18] = bVar1;
      auVar20._25_3_ = 0;
      auVar20[0x1c] = bVar1;
      auVar20._29_3_ = 0;
      auVar21 = ZEXT3264(_DAT_00318c60);
      uVar14 = 0;
      auVar105[8] = 1;
      auVar105._0_8_ = 0x101010101010101;
      auVar105[9] = 1;
      auVar105[10] = 1;
      auVar105[0xb] = 1;
      auVar105[0xc] = 1;
      auVar105[0xd] = 1;
      auVar105[0xe] = 1;
      auVar105[0xf] = 1;
      auVar17 = ZEXT816(0) << 0x20;
      auVar28 = ZEXT816(0);
      auVar46 = ZEXT816(0);
      auVar57 = ZEXT816(0);
      auVar65 = ZEXT816(0);
      auVar71 = ZEXT816(0) << 0x40;
      auVar87 = ZEXT816(0) << 0x40;
      auVar101 = ZEXT816(0) << 0x40;
      auVar106 = ZEXT816(0) << 0x40;
      while( true ) {
        fVar5 = auVar71._4_4_;
        fVar7 = auVar71._8_4_;
        fVar55 = auVar71._12_4_;
        fVar51 = auVar46._4_4_;
        fVar52 = auVar46._8_4_;
        fVar92 = auVar46._12_4_;
        fVar39 = auVar28._4_4_;
        fVar40 = auVar28._8_4_;
        fVar93 = auVar28._12_4_;
        fVar6 = auVar87._4_4_;
        fVar41 = auVar87._8_4_;
        fVar43 = auVar87._12_4_;
        fVar79 = auVar17._4_4_;
        fVar22 = auVar17._8_4_;
        fVar94 = auVar17._12_4_;
        fVar107 = auVar106._4_4_;
        fVar108 = auVar106._8_4_;
        fVar102 = auVar101._4_4_;
        fVar103 = auVar101._8_4_;
        fVar4 = auVar65._4_4_;
        fVar54 = auVar65._8_4_;
        fVar42 = auVar57._4_4_;
        fVar8 = auVar57._8_4_;
        fVar53 = auVar65._12_4_;
        fVar61 = auVar57._12_4_;
        fVar109 = auVar106._12_4_;
        fVar104 = auVar101._12_4_;
        if (uVar15 <= uVar14) break;
        auVar50 = vpcmpgtd_avx2(auVar20,auVar21._0_32_);
        auVar110._8_8_ = 0;
        auVar110._0_8_ = *(ulong *)(pi->partition_of_texel + uVar14);
        auVar24 = vpcmpeqb_avx(auVar110,_DAT_00264480);
        auVar85 = vpmovsxbd_avx2(auVar24);
        auVar85 = vpand_avx2(auVar85,auVar50);
        auVar24 = vpcmpeqb_avx(auVar110,auVar105);
        auVar10 = vpmovsxbd_avx2(auVar24);
        auVar10 = vpand_avx2(auVar10,auVar50);
        auVar98[8] = 2;
        auVar98._0_8_ = 0x202020202020202;
        auVar98[9] = 2;
        auVar98[10] = 2;
        auVar98[0xb] = 2;
        auVar98[0xc] = 2;
        auVar98[0xd] = 2;
        auVar98[0xe] = 2;
        auVar98[0xf] = 2;
        auVar111._8_8_ = 0;
        auVar111._0_8_ = *(ulong *)(pi->partition_of_texel + uVar14);
        auVar24 = vpcmpeqb_avx(auVar111,auVar98);
        auVar78 = vpmovsxbd_avx2(auVar24);
        auVar78 = vpand_avx2(auVar78,auVar50);
        auVar50 = *(undefined1 (*) [32])(blk->data_r + uVar14);
        auVar96 = vpand_avx2(auVar85,auVar50);
        auVar106._0_4_ = auVar96._16_4_ + auVar106._0_4_ + auVar96._0_4_;
        auVar106._4_4_ = auVar96._20_4_ + fVar107 + auVar96._4_4_;
        auVar106._8_4_ = auVar96._24_4_ + fVar108 + auVar96._8_4_;
        auVar106._12_4_ = auVar96._28_4_ + fVar109 + auVar96._12_4_;
        auVar96 = vpand_avx2(auVar10,auVar50);
        auVar71._0_4_ = auVar96._16_4_ + auVar96._0_4_ + auVar71._0_4_;
        auVar71._4_4_ = auVar96._20_4_ + auVar96._4_4_ + fVar5;
        auVar71._8_4_ = auVar96._24_4_ + auVar96._8_4_ + fVar7;
        auVar71._12_4_ = auVar96._28_4_ + auVar96._12_4_ + fVar55;
        auVar50 = vpand_avx2(auVar78,auVar50);
        auVar46._0_4_ = auVar50._16_4_ + auVar46._0_4_ + auVar50._0_4_;
        auVar46._4_4_ = auVar50._20_4_ + fVar51 + auVar50._4_4_;
        auVar46._8_4_ = auVar50._24_4_ + fVar52 + auVar50._8_4_;
        auVar46._12_4_ = auVar50._28_4_ + fVar92 + auVar50._12_4_;
        auVar50 = *(undefined1 (*) [32])(blk->data_g + uVar14);
        auVar96 = vpand_avx2(auVar85,auVar50);
        auVar101._0_4_ = auVar96._16_4_ + auVar101._0_4_ + auVar96._0_4_;
        auVar101._4_4_ = auVar96._20_4_ + fVar102 + auVar96._4_4_;
        auVar101._8_4_ = auVar96._24_4_ + fVar103 + auVar96._8_4_;
        auVar101._12_4_ = auVar96._28_4_ + fVar104 + auVar96._12_4_;
        auVar96 = vpand_avx2(auVar10,auVar50);
        auVar65._0_4_ = auVar96._16_4_ + auVar96._0_4_ + auVar65._0_4_;
        auVar65._4_4_ = auVar96._20_4_ + auVar96._4_4_ + fVar4;
        auVar65._8_4_ = auVar96._24_4_ + auVar96._8_4_ + fVar54;
        auVar65._12_4_ = auVar96._28_4_ + auVar96._12_4_ + fVar53;
        auVar50 = vpand_avx2(auVar78,auVar50);
        auVar28._0_4_ = auVar50._16_4_ + auVar28._0_4_ + auVar50._0_4_;
        auVar28._4_4_ = auVar50._20_4_ + fVar39 + auVar50._4_4_;
        auVar28._8_4_ = auVar50._24_4_ + fVar40 + auVar50._8_4_;
        auVar28._12_4_ = auVar50._28_4_ + fVar93 + auVar50._12_4_;
        auVar50 = *(undefined1 (*) [32])(blk->data_b + uVar14);
        auVar85 = vpand_avx2(auVar85,auVar50);
        auVar87._0_4_ = auVar85._16_4_ + auVar85._0_4_ + auVar87._0_4_;
        auVar87._4_4_ = auVar85._20_4_ + auVar85._4_4_ + fVar6;
        auVar87._8_4_ = auVar85._24_4_ + auVar85._8_4_ + fVar41;
        auVar87._12_4_ = auVar85._28_4_ + auVar85._12_4_ + fVar43;
        auVar85 = vpand_avx2(auVar10,auVar50);
        auVar57._0_4_ = auVar85._16_4_ + auVar85._0_4_ + auVar57._0_4_;
        auVar57._4_4_ = auVar85._20_4_ + auVar85._4_4_ + fVar42;
        auVar57._8_4_ = auVar85._24_4_ + auVar85._8_4_ + fVar8;
        auVar57._12_4_ = auVar85._28_4_ + auVar85._12_4_ + fVar61;
        auVar50 = vpand_avx2(auVar78,auVar50);
        auVar17._0_4_ = auVar50._16_4_ + auVar17._0_4_ + auVar50._0_4_;
        auVar17._4_4_ = auVar50._20_4_ + fVar79 + auVar50._4_4_;
        auVar17._8_4_ = auVar50._24_4_ + fVar22 + auVar50._8_4_;
        auVar17._12_4_ = auVar50._28_4_ + fVar94 + auVar50._12_4_;
        auVar10._8_4_ = 8;
        auVar10._0_8_ = 0x800000008;
        auVar10._12_4_ = 8;
        auVar10._16_4_ = 8;
        auVar10._20_4_ = 8;
        auVar10._24_4_ = 8;
        auVar10._28_4_ = 8;
        auVar50 = vpaddd_avx2(auVar21._0_32_,auVar10);
        auVar21 = ZEXT3264(auVar50);
        uVar14 = uVar14 + 8;
      }
      fVar80 = (float)uVar12;
      auVar24 = vshufpd_avx(auVar106,auVar106,1);
      auVar95._0_4_ = auVar106._0_4_ + auVar24._0_4_;
      auVar95._4_4_ = fVar107 + auVar24._4_4_;
      auVar95._8_4_ = fVar108 + auVar24._8_4_;
      auVar95._12_4_ = fVar109 + auVar24._12_4_;
      auVar63 = vhaddps_avx(auVar95,auVar95);
      auVar24 = vshufpd_avx(auVar101,auVar101,1);
      auVar99._0_4_ = auVar101._0_4_ + auVar24._0_4_;
      auVar99._4_4_ = fVar102 + auVar24._4_4_;
      auVar99._8_4_ = fVar103 + auVar24._8_4_;
      auVar99._12_4_ = fVar104 + auVar24._12_4_;
      auVar16 = vhaddps_avx(auVar99,auVar99);
      auVar24 = vblendps_avx(ZEXT816(0) << 0x40,*(undefined1 (*) [16])(blk->data_mean).m,7);
      auVar26 = vshufpd_avx(auVar87,auVar87,1);
      auVar89._0_4_ = auVar26._0_4_ + auVar87._0_4_;
      auVar89._4_4_ = auVar26._4_4_ + fVar6;
      auVar89._8_4_ = auVar26._8_4_ + fVar41;
      auVar89._12_4_ = auVar26._12_4_ + fVar43;
      auVar26 = vhaddps_avx(auVar89,auVar89);
      auVar25 = vshufpd_avx(auVar71,auVar71,1);
      auVar73._0_4_ = auVar25._0_4_ + auVar71._0_4_;
      auVar73._4_4_ = auVar25._4_4_ + fVar5;
      auVar73._8_4_ = auVar25._8_4_ + fVar7;
      auVar73._12_4_ = auVar25._12_4_ + fVar55;
      auVar25 = vhaddps_avx(auVar73,auVar73);
      auVar74._0_4_ = auVar24._0_4_ * fVar80;
      auVar74._4_4_ = auVar24._4_4_ * fVar80;
      auVar74._8_4_ = auVar24._8_4_ * fVar80;
      auVar74._12_4_ = auVar24._12_4_ * fVar80;
      auVar24 = vshufpd_avx(auVar65,auVar65,1);
      auVar67._0_4_ = auVar65._0_4_ + auVar24._0_4_;
      auVar67._4_4_ = fVar4 + auVar24._4_4_;
      auVar67._8_4_ = fVar54 + auVar24._8_4_;
      auVar67._12_4_ = fVar53 + auVar24._12_4_;
      auVar27 = vhaddps_avx(auVar67,auVar67);
      auVar24 = vshufpd_avx(auVar57,auVar57,1);
      auVar59._0_4_ = auVar57._0_4_ + auVar24._0_4_;
      auVar59._4_4_ = fVar42 + auVar24._4_4_;
      auVar59._8_4_ = fVar8 + auVar24._8_4_;
      auVar59._12_4_ = fVar61 + auVar24._12_4_;
      auVar45 = vhaddps_avx(auVar59,auVar59);
      auVar24 = vinsertps_avx(auVar63,auVar16,0x1c);
      auVar24 = vblendps_avx(auVar24,auVar26,4);
      auVar63 = vshufpd_avx(auVar46,auVar46,1);
      auVar48._0_4_ = auVar46._0_4_ + auVar63._0_4_;
      auVar48._4_4_ = fVar51 + auVar63._4_4_;
      auVar48._8_4_ = fVar52 + auVar63._8_4_;
      auVar48._12_4_ = fVar92 + auVar63._12_4_;
      auVar16 = vhaddps_avx(auVar48,auVar48);
      auVar63 = vshufpd_avx(auVar28,auVar28,1);
      auVar33._0_4_ = auVar28._0_4_ + auVar63._0_4_;
      auVar33._4_4_ = fVar39 + auVar63._4_4_;
      auVar33._8_4_ = fVar40 + auVar63._8_4_;
      auVar33._12_4_ = fVar93 + auVar63._12_4_;
      auVar26 = vhaddps_avx(auVar33,auVar33);
      auVar63 = vinsertps_avx(auVar25,auVar27,0x1c);
      auVar63 = vblendps_avx(auVar63,auVar45,4);
      auVar26 = vinsertps_avx(auVar16,auVar26,0x1c);
      auVar16 = vshufpd_avx(auVar17,auVar17,1);
      auVar19._0_4_ = auVar17._0_4_ + auVar16._0_4_;
      auVar19._4_4_ = fVar79 + auVar16._4_4_;
      auVar19._8_4_ = fVar22 + auVar16._8_4_;
      auVar19._12_4_ = fVar94 + auVar16._12_4_;
      auVar16 = vhaddps_avx(auVar19,auVar19);
      fVar42 = (float)pi->partition_texel_count[0];
      auVar16 = vblendps_avx(auVar26,auVar16,4);
      auVar34._4_4_ = fVar42;
      auVar34._0_4_ = fVar42;
      auVar34._8_4_ = fVar42;
      auVar34._12_4_ = fVar42;
      afVar9 = (__m128)vdivps_avx(auVar24,auVar34);
      partition_averages[0].m[0] = afVar9[0];
      partition_averages[0].m[1] = afVar9[1];
      partition_averages[0].m[2] = afVar9[2];
      partition_averages[0].m[3] = afVar9[3];
      auVar35._0_4_ = (float)pi->partition_texel_count[1];
      auVar24 = vsubps_avx(auVar74,auVar24);
      auVar35._4_4_ = auVar35._0_4_;
      auVar35._8_4_ = auVar35._0_4_;
      auVar35._12_4_ = auVar35._0_4_;
      afVar9 = (__m128)vdivps_avx(auVar63,auVar35);
      partition_averages[1].m[0] = afVar9[0];
      partition_averages[1].m[1] = afVar9[1];
      partition_averages[1].m[2] = afVar9[2];
      partition_averages[1].m[3] = afVar9[3];
      auVar36._0_4_ = (float)pi->partition_texel_count[2];
      auVar24 = vsubps_avx(auVar24,auVar63);
      auVar36._4_4_ = auVar36._0_4_;
      auVar36._8_4_ = auVar36._0_4_;
      auVar36._12_4_ = auVar36._0_4_;
      afVar9 = (__m128)vdivps_avx(auVar16,auVar36);
      partition_averages[2].m[0] = afVar9[0];
      partition_averages[2].m[1] = afVar9[1];
      partition_averages[2].m[2] = afVar9[2];
      partition_averages[2].m[3] = afVar9[3];
      auVar37._0_4_ = (float)pi->partition_texel_count[3];
      auVar24 = vsubps_avx(auVar24,auVar16);
      auVar37._4_4_ = auVar37._0_4_;
      auVar37._8_4_ = auVar37._0_4_;
      auVar37._12_4_ = auVar37._0_4_;
      afVar9 = (__m128)vdivps_avx(auVar24,auVar37);
      partition_averages[3].m[0] = afVar9[0];
      partition_averages[3].m[1] = afVar9[1];
      partition_averages[3].m[2] = afVar9[2];
      partition_averages[3].m[3] = afVar9[3];
    }
  }
  pauVar13 = pi->texels_of_partition;
  uVar15 = 0;
  while( true ) {
    if (uVar15 == uVar11) {
      return;
    }
    bVar1 = pi->partition_texel_count[uVar15];
    if ((ulong)bVar1 == 0) break;
    auVar24 = *(undefined1 (*) [16])partition_averages[uVar15].m;
    *(undefined1 (*) [16])pm[uVar15].avg.m = auVar24;
    auVar38 = ZEXT816(0) << 0x40;
    uVar14 = 0;
    auVar49 = ZEXT816(0) << 0x40;
    auVar60 = ZEXT816(0) << 0x40;
    while( true ) {
      fVar55 = auVar60._0_4_;
      fVar43 = auVar49._0_4_;
      fVar54 = auVar38._0_4_;
      fVar42 = auVar60._4_4_;
      fVar5 = auVar60._8_4_;
      fVar4 = auVar49._4_4_;
      fVar7 = auVar49._8_4_;
      fVar6 = auVar38._4_4_;
      fVar8 = auVar38._8_4_;
      fVar61 = auVar60._12_4_;
      fVar53 = auVar49._12_4_;
      fVar41 = auVar38._12_4_;
      if (bVar1 == uVar14) break;
      bVar2 = (*pauVar13)[uVar14];
      auVar63 = vinsertps_avx(ZEXT416((uint)blk->data_r[bVar2]),ZEXT416((uint)blk->data_g[bVar2]),
                              0x1c);
      auVar63 = vinsertps_avx(auVar63,ZEXT416((uint)blk->data_b[bVar2]),0x28);
      auVar26 = vsubps_avx(auVar63,auVar24);
      auVar16 = vcmpps_avx(ZEXT816(0) << 0x40,auVar26,1);
      uVar81 = auVar16._0_4_;
      auVar90._4_4_ = uVar81;
      auVar90._0_4_ = uVar81;
      auVar90._8_4_ = uVar81;
      auVar90._12_4_ = uVar81;
      auVar63 = vandps_avx(auVar90,auVar26);
      auVar60._0_4_ = fVar55 + auVar63._0_4_;
      auVar60._4_4_ = fVar42 + auVar63._4_4_;
      auVar60._8_4_ = fVar5 + auVar63._8_4_;
      auVar60._12_4_ = fVar61 + auVar63._12_4_;
      auVar63 = vshufps_avx(auVar16,auVar16,0x55);
      auVar63 = vandps_avx(auVar63,auVar26);
      auVar49._0_4_ = fVar43 + auVar63._0_4_;
      auVar49._4_4_ = fVar4 + auVar63._4_4_;
      auVar49._8_4_ = fVar7 + auVar63._8_4_;
      auVar49._12_4_ = fVar53 + auVar63._12_4_;
      auVar63 = vshufps_avx(auVar16,auVar16,0xaa);
      auVar63 = vandps_avx(auVar63,auVar26);
      auVar38._0_4_ = fVar54 + auVar63._0_4_;
      auVar38._4_4_ = fVar6 + auVar63._4_4_;
      auVar38._8_4_ = fVar8 + auVar63._8_4_;
      auVar38._12_4_ = fVar41 + auVar63._12_4_;
      uVar14 = uVar14 + 1;
    }
    auVar68._0_4_ = fVar55 * fVar55;
    auVar68._4_4_ = fVar42 * fVar42;
    auVar68._8_4_ = fVar5 * fVar5;
    auVar68._12_4_ = fVar61 * fVar61;
    auVar24 = vshufpd_avx(auVar68,auVar68,1);
    auVar69._0_4_ = auVar68._0_4_ + auVar24._0_4_;
    auVar69._4_4_ = auVar68._4_4_ + auVar24._4_4_;
    auVar69._8_4_ = auVar68._8_4_ + auVar24._8_4_;
    auVar69._12_4_ = auVar68._12_4_ + auVar24._12_4_;
    auVar24 = vhaddps_avx(auVar69,auVar69);
    auVar75._0_4_ = fVar43 * fVar43;
    auVar75._4_4_ = fVar4 * fVar4;
    auVar75._8_4_ = fVar7 * fVar7;
    auVar75._12_4_ = fVar53 * fVar53;
    auVar63 = vshufpd_avx(auVar75,auVar75,1);
    auVar76._0_4_ = auVar75._0_4_ + auVar63._0_4_;
    auVar76._4_4_ = auVar75._4_4_ + auVar63._4_4_;
    auVar76._8_4_ = auVar75._8_4_ + auVar63._8_4_;
    auVar76._12_4_ = auVar75._12_4_ + auVar63._12_4_;
    auVar63 = vhaddps_avx(auVar76,auVar76);
    auVar70._0_4_ = auVar24._0_4_;
    auVar70._4_4_ = auVar70._0_4_;
    auVar70._8_4_ = auVar70._0_4_;
    auVar70._12_4_ = auVar70._0_4_;
    auVar77._0_4_ = auVar63._0_4_;
    auVar77._4_4_ = auVar77._0_4_;
    auVar77._8_4_ = auVar77._0_4_;
    auVar77._12_4_ = auVar77._0_4_;
    auVar82._0_4_ = fVar54 * fVar54;
    auVar82._4_4_ = fVar6 * fVar6;
    auVar82._8_4_ = fVar8 * fVar8;
    auVar82._12_4_ = fVar41 * fVar41;
    auVar24 = vshufpd_avx(auVar82,auVar82,1);
    auVar83._0_4_ = auVar82._0_4_ + auVar24._0_4_;
    auVar83._4_4_ = auVar82._4_4_ + auVar24._4_4_;
    auVar83._8_4_ = auVar82._8_4_ + auVar24._8_4_;
    auVar83._12_4_ = auVar82._12_4_ + auVar24._12_4_;
    auVar24 = vhaddps_avx(auVar83,auVar83);
    auVar84._0_4_ = auVar24._0_4_;
    auVar84._4_4_ = auVar84._0_4_;
    auVar84._8_4_ = auVar84._0_4_;
    auVar84._12_4_ = auVar84._0_4_;
    auVar24 = vcmpps_avx(auVar70,auVar77,1);
    auVar24 = vblendvps_avx(auVar60,auVar49,auVar24);
    auVar63 = vmaxps_avx(auVar77,auVar70);
    auVar63 = vcmpps_avx(auVar63,auVar84,1);
    auVar24 = vblendvps_avx(auVar24,auVar38,auVar63);
    *(undefined1 (*) [16])pm[uVar15].dir.m = auVar24;
    uVar15 = uVar15 + 1;
    pauVar13 = pauVar13 + 1;
  }
  __assert_fail("texel_count > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_averages_and_directions.cpp"
                ,0x248,
                "void compute_avgs_and_dirs_3_comp_rgb(const partition_info &, const image_block &, partition_metrics *)"
               );
}

Assistant:

void compute_avgs_and_dirs_3_comp_rgb(
	const partition_info& pi,
	const image_block& blk,
	partition_metrics pm[BLOCK_MAX_PARTITIONS]
) {
	unsigned int partition_count = pi.partition_count;
	promise(partition_count > 0);

	// Pre-compute partition_averages
	vfloat4 partition_averages[BLOCK_MAX_PARTITIONS];
	compute_partition_averages_rgb(pi, blk, partition_averages);

	for (unsigned int partition = 0; partition < partition_count; partition++)
	{
		const uint8_t *texel_indexes = pi.texels_of_partition[partition];
		unsigned int texel_count = pi.partition_texel_count[partition];
		promise(texel_count > 0);

		vfloat4 average = partition_averages[partition];
		pm[partition].avg = average;

		vfloat4 sum_xp = vfloat4::zero();
		vfloat4 sum_yp = vfloat4::zero();
		vfloat4 sum_zp = vfloat4::zero();

		for (unsigned int i = 0; i < texel_count; i++)
		{
			unsigned int iwt = texel_indexes[i];

			vfloat4 texel_datum = blk.texel3(iwt);
			texel_datum = texel_datum - average;

			vfloat4 zero = vfloat4::zero();

			vmask4 tdm0 = texel_datum.swz<0,0,0,0>() > zero;
			sum_xp += select(zero, texel_datum, tdm0);

			vmask4 tdm1 = texel_datum.swz<1,1,1,1>() > zero;
			sum_yp += select(zero, texel_datum, tdm1);

			vmask4 tdm2 = texel_datum.swz<2,2,2,2>() > zero;
			sum_zp += select(zero, texel_datum, tdm2);
		}

		vfloat4 prod_xp = dot(sum_xp, sum_xp);
		vfloat4 prod_yp = dot(sum_yp, sum_yp);
		vfloat4 prod_zp = dot(sum_zp, sum_zp);

		vfloat4 best_vector = sum_xp;
		vfloat4 best_sum = prod_xp;

		vmask4 mask = prod_yp > best_sum;
		best_vector = select(best_vector, sum_yp, mask);
		best_sum = select(best_sum, prod_yp, mask);

		mask = prod_zp > best_sum;
		best_vector = select(best_vector, sum_zp, mask);

		pm[partition].dir = best_vector;
	}
}